

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
::ConvertFromStruct(JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_ElementsDecodeRawTransactionTxOutStruct>
                    *this,vector<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
                          *list)

{
  pointer pEVar1;
  pointer data;
  ElementsDecodeRawTransactionTxOut object;
  ElementsDecodeRawTransactionTxOut EStack_2a8;
  
  pEVar1 = (list->
           super__Vector_base<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (data = (list->
              super__Vector_base<ElementsDecodeRawTransactionTxOutStruct,_std::allocator<ElementsDecodeRawTransactionTxOutStruct>_>
              )._M_impl.super__Vector_impl_data._M_start; data != pEVar1; data = data + 1) {
    cfd::api::json::ElementsDecodeRawTransactionTxOut::ElementsDecodeRawTransactionTxOut
              (&EStack_2a8);
    cfd::api::json::ElementsDecodeRawTransactionTxOut::ConvertFromStruct(&EStack_2a8,data);
    ::std::
    vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>
    ::push_back(&(this->super_JsonVector<cfd::api::json::ElementsDecodeRawTransactionTxOut>).
                 super_vector<cfd::api::json::ElementsDecodeRawTransactionTxOut,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>
                ,&EStack_2a8);
    cfd::api::json::ElementsDecodeRawTransactionTxOut::~ElementsDecodeRawTransactionTxOut
              (&EStack_2a8);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }